

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StepExporter.cpp
# Opt level: O0

void __thiscall
Assimp::StepExporter::StepExporter
          (StepExporter *this,aiScene *pScene,IOSystem *pIOSystem,string *path,string *file,
          ExportProperties *pProperties)

{
  locale local_58 [8];
  locale local_50 [11];
  allocator<char> local_45 [13];
  ExportProperties *local_38;
  ExportProperties *pProperties_local;
  string *file_local;
  string *path_local;
  IOSystem *pIOSystem_local;
  aiScene *pScene_local;
  StepExporter *this_local;
  
  local_38 = pProperties;
  pProperties_local = (ExportProperties *)file;
  file_local = path;
  path_local = (string *)pIOSystem;
  pIOSystem_local = (IOSystem *)pScene;
  pScene_local = (aiScene *)this;
  std::__cxx11::stringstream::stringstream((stringstream *)this);
  this->mProperties = local_38;
  this->mIOSystem = (IOSystem *)path_local;
  std::__cxx11::string::string((string *)&this->mFile,(string *)pProperties_local);
  std::__cxx11::string::string((string *)&this->mPath,(string *)file_local);
  this->mScene = (aiScene *)pIOSystem_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->endstr,";\n",local_45);
  std::allocator<char>::~allocator(local_45);
  std::
  map<const_aiNode_*,_aiMatrix4x4t<float>,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_aiMatrix4x4t<float>_>_>_>
  ::map(&this->trafos);
  std::
  multimap<const_aiNode_*,_unsigned_int,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_unsigned_int>_>_>
  ::multimap(&this->meshes);
  anon_unknown.dwarf_2aefd9::CollectTrafos
            ((aiNode *)
             (pIOSystem_local->m_pathStack).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&this->trafos);
  anon_unknown.dwarf_2aefd9::CollectMeshes
            ((aiNode *)
             (pIOSystem_local->m_pathStack).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&this->meshes);
  std::locale::locale(local_58,"C");
  std::ios::imbue(local_50);
  std::locale::~locale(local_50);
  std::locale::~locale(local_58);
  std::ios_base::precision((ios_base *)(&this->mOutput + *(long *)(*(long *)this + -0x18)),8);
  WriteFile(this);
  return;
}

Assistant:

StepExporter::StepExporter(const aiScene* pScene, IOSystem* pIOSystem, const std::string& path,
    const std::string& file, const ExportProperties* pProperties) :
    mProperties(pProperties), mIOSystem(pIOSystem), mFile(file), mPath(path),
    mScene(pScene), endstr(";\n") {
    CollectTrafos(pScene->mRootNode, trafos);
    CollectMeshes(pScene->mRootNode, meshes);

    // make sure that all formatting happens using the standard, C locale and not the user's current locale
    mOutput.imbue(std::locale("C"));
    mOutput.precision(ASSIMP_AI_REAL_TEXT_PRECISION);

    // start writing
    WriteFile();
}